

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Implementation.hpp
# Opt level: O2

void __thiscall
CPU::Z80::Processor<Sinclair::ZX8081::ConcreteMachine<true>,_false,_true>::copy_program
          (Processor<Sinclair::ZX8081::ConcreteMachine<true>,_false,_true> *this,MicroOp *source,
          vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
          *destination)

{
  Type *pTVar1;
  
  do {
    std::
    vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
    ::emplace_back<CPU::Z80::ProcessorStorage::MicroOp_const&>
              ((vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
                *)destination,source);
    pTVar1 = &source->type;
    source = source + 1;
  } while ((*pTVar1 & ~IncrementR) != DecodeOperation);
  return;
}

Assistant:

void Processor <T, uses_bus_request, uses_wait_line>
		::copy_program(const MicroOp *source, std::vector<MicroOp> &destination) {
	std::size_t length = 0;
	while(!is_terminal(source[length].type)) length++;
	std::size_t pointer = 0;
	while(true) {
		// TODO: This test is duplicated from assemble_page; can a better factoring be found?
		// Skip optional waits if this instance doesn't use the wait line.
		if(source[pointer].machine_cycle.was_requested && !uses_wait_line) {
			pointer++;
			continue;
		}

		destination.emplace_back(source[pointer]);
		if(is_terminal(source[pointer].type)) break;
		pointer++;
	}
}